

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

us_socket_t *
us_socket_context_adopt_socket(int ssl,us_socket_context_t *context,us_socket_t *s,int ext_size)

{
  int iVar1;
  undefined4 in_ECX;
  us_internal_ssl_socket_t *in_RDX;
  us_socket_context_t *in_RSI;
  int in_EDI;
  us_socket_t *new_s;
  us_internal_ssl_socket_t *in_stack_ffffffffffffffc8;
  us_internal_ssl_socket_context_t *in_stack_ffffffffffffffd0;
  uint ext_size_00;
  undefined4 in_stack_ffffffffffffffd8;
  us_internal_ssl_socket_t *local_8;
  
  if (in_EDI == 0) {
    iVar1 = us_socket_is_closed(0,&in_RDX->s);
    ext_size_00 = (uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
    local_8 = in_RDX;
    if (iVar1 == 0) {
      us_internal_socket_context_unlink((in_RDX->s).context,&in_RDX->s);
      local_8 = (us_internal_ssl_socket_t *)
                us_poll_resize((us_poll_t *)in_RDX,
                               (us_loop_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),ext_size_00);
      us_internal_socket_context_link(in_RSI,(us_socket_t *)local_8);
    }
  }
  else {
    local_8 = us_internal_ssl_socket_context_adopt_socket
                        (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
  }
  return &local_8->s;
}

Assistant:

struct us_socket_t *us_socket_context_adopt_socket(int ssl, struct us_socket_context_t *context, struct us_socket_t *s, int ext_size) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        return (struct us_socket_t *) us_internal_ssl_socket_context_adopt_socket((struct us_internal_ssl_socket_context_t *) context, (struct us_internal_ssl_socket_t *) s, ext_size);
    }
#endif

    /* Cannot adopt a closed socket */
    if (us_socket_is_closed(ssl, s)) {
        return s;
    }

    /* This properly updates the iterator if in on_timeout */
    us_internal_socket_context_unlink(s->context, s);

    struct us_socket_t *new_s = (struct us_socket_t *) us_poll_resize(&s->p, s->context->loop, sizeof(struct us_socket_t) + ext_size);

    us_internal_socket_context_link(context, new_s);

    return new_s;
}